

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtils.cpp
# Opt level: O2

EmptyFileCreatorDisposer *
ApprovalTests::FileUtils::useEmptyFileCreator
          (EmptyFileCreatorDisposer *__return_storage_ptr__,EmptyFileCreator *creator)

{
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_30;
  
  ::std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function(&local_30,creator);
  EmptyFileCreatorDisposer::EmptyFileCreatorDisposer(__return_storage_ptr__,&local_30);
  ::std::_Function_base::~_Function_base(&local_30.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

EmptyFileCreatorDisposer FileUtils::useEmptyFileCreator(EmptyFileCreator creator)
    {
        return EmptyFileCreatorDisposer(creator);
    }